

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
    const char xxxxx[] = "xxxxx";
    TESTCASE( memcmp( abcde, abcdx, 5 ) < 0 );
    TESTCASE( memcmp( abcde, abcdx, 4 ) == 0 );
    TESTCASE( memcmp( abcde, xxxxx, 0 ) == 0 );
    TESTCASE( memcmp( xxxxx, abcde, 1 ) > 0 );
    return 0;
}